

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsyncLogger.cpp
# Opt level: O0

void __thiscall clog::AsyncLogger::start(AsyncLogger *this)

{
  type local_20;
  thread local_18;
  AsyncLogger *local_10;
  AsyncLogger *this_local;
  
  this->running_ = true;
  local_20.this = this;
  local_10 = this;
  std::thread::thread<clog::AsyncLogger::start()::__0,,void>(&local_18,&local_20);
  std::thread::operator=(&this->thread_,&local_18);
  std::thread::~thread(&local_18);
  return;
}

Assistant:

void AsyncLogger::start()
{
    running_ = true;
    thread_ = std::thread([this](){  this->threadFunc(); });
}